

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAndAbs.c
# Opt level: O3

DdNode * cuddBddAndAbstractRecur(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  DdNode *cube_00;
  DdNode *pDVar5;
  abctime aVar6;
  DdNode *g_00;
  uint index;
  uint *puVar7;
  DdNode *pDVar8;
  DdHalfWord *pDVar9;
  DdNode *pDVar10;
  uint *puVar11;
  uint uVar12;
  DdNode *local_50;
  
  pDVar5 = manager->one;
  pDVar10 = (DdNode *)((ulong)pDVar5 ^ 1);
  if (((((DdNode *)((ulong)g ^ 1) == f) || (pDVar10 == f)) || (pDVar10 == g)) ||
     (pDVar10 = pDVar5, pDVar5 == g && pDVar5 == f)) {
    return pDVar10;
  }
  if (pDVar5 != cube) {
    pDVar10 = g;
    if ((f == g || pDVar5 == f) || (pDVar10 = f, pDVar5 == g)) {
      pDVar5 = cuddBddExistAbstractRecur(manager,pDVar10,cube);
      return pDVar5;
    }
    if (g < f) {
      pDVar10 = g;
      g = f;
    }
    f = pDVar10;
    puVar7 = (uint *)((ulong)f & 0xfffffffffffffffe);
    puVar11 = (uint *)((ulong)g & 0xfffffffffffffffe);
    piVar4 = manager->perm;
    uVar1 = piVar4[*puVar7];
    uVar2 = piVar4[*puVar11];
    uVar12 = uVar1;
    if (uVar2 < uVar1) {
      uVar12 = uVar2;
    }
    do {
      uVar3 = piVar4[cube->index];
      if (uVar12 <= uVar3) {
        if (((puVar7[1] != 1) || (puVar11[1] != 1)) &&
           (pDVar10 = cuddCacheLookup(manager,6,f,g,cube), pDVar10 != (DdNode *)0x0)) {
          return pDVar10;
        }
        if ((manager->TimeStop != 0) && (aVar6 = Abc_Clock(), manager->TimeStop < aVar6)) {
          return (DdNode *)0x0;
        }
        if (uVar2 < uVar1) {
          index = *puVar11;
          pDVar10 = f;
          local_50 = f;
        }
        else {
          index = *puVar7;
          pDVar10 = *(DdNode **)(puVar7 + 4);
          local_50 = *(DdNode **)(puVar7 + 6);
          if (((ulong)f & 1) != 0) {
            pDVar10 = (DdNode *)((ulong)pDVar10 ^ 1);
            local_50 = (DdNode *)((ulong)local_50 ^ 1);
          }
        }
        g_00 = g;
        pDVar8 = g;
        if (uVar2 <= uVar1) {
          pDVar8 = *(DdNode **)(puVar11 + 4);
          g_00 = *(DdNode **)(puVar11 + 6);
          if (((ulong)g & 1) != 0) {
            pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
            g_00 = (DdNode *)((ulong)g_00 ^ 1);
          }
        }
        if (uVar3 == uVar12) {
          cube_00 = (cube->type).kids.T;
          pDVar10 = cuddBddAndAbstractRecur(manager,pDVar10,pDVar8,cube_00);
          if (pDVar10 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          if (((pDVar10 == pDVar5) || (pDVar10 == local_50)) || (pDVar10 == g_00))
          goto LAB_00804592;
          piVar4 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
          *piVar4 = *piVar4 + 1;
          pDVar5 = g_00;
          if ((pDVar10 == (DdNode *)((ulong)local_50 ^ 1)) ||
             (pDVar5 = local_50, pDVar10 == (DdNode *)((ulong)g_00 ^ 1))) {
            pDVar5 = cuddBddExistAbstractRecur(manager,pDVar5,cube_00);
          }
          else {
            pDVar5 = cuddBddAndAbstractRecur(manager,local_50,g_00,cube_00);
          }
          if (pDVar5 == (DdNode *)0x0) goto LAB_00804576;
          if (pDVar10 == pDVar5) {
            pDVar9 = (DdHalfWord *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
          }
          else {
            piVar4 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + 1;
            pDVar8 = cuddBddAndRecur(manager,(DdNode *)((ulong)pDVar10 ^ 1),
                                     (DdNode *)((ulong)pDVar5 ^ 1));
            if (pDVar8 == (DdNode *)0x0) {
              Cudd_IterDerefBdd(manager,pDVar10);
              pDVar10 = pDVar5;
              goto LAB_00804576;
            }
            piVar4 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + 1;
            pDVar9 = (DdHalfWord *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
            Cudd_DelayedDerefBdd(manager,pDVar10);
            Cudd_DelayedDerefBdd(manager,pDVar5);
            pDVar10 = (DdNode *)((ulong)pDVar8 ^ 1);
          }
        }
        else {
          pDVar10 = cuddBddAndAbstractRecur(manager,pDVar10,pDVar8,cube);
          if (pDVar10 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          pDVar8 = (DdNode *)((ulong)pDVar10 & 0xfffffffffffffffe);
          pDVar8->ref = pDVar8->ref + 1;
          pDVar5 = cuddBddAndAbstractRecur(manager,local_50,g_00,cube);
          if (pDVar5 == (DdNode *)0x0) goto LAB_00804576;
          pDVar9 = &pDVar8->ref;
          if (pDVar10 != pDVar5) {
            piVar4 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + 1;
            if (((ulong)pDVar10 & 1) == 0) {
              pDVar8 = cuddUniqueInter(manager,index,pDVar10,pDVar5);
              if (pDVar8 == (DdNode *)0x0) {
                Cudd_IterDerefBdd(manager,pDVar10);
                pDVar10 = pDVar5;
                goto LAB_00804576;
              }
            }
            else {
              pDVar8 = cuddUniqueInter(manager,index,pDVar8,(DdNode *)((ulong)pDVar5 ^ 1));
              if (pDVar8 == (DdNode *)0x0) {
                Cudd_IterDerefBdd(manager,pDVar10);
                pDVar10 = pDVar5;
LAB_00804576:
                Cudd_IterDerefBdd(manager,pDVar10);
                return (DdNode *)0x0;
              }
              pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
            }
            piVar4 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + -1;
            pDVar10 = pDVar8;
          }
        }
        *pDVar9 = *pDVar9 - 1;
LAB_00804592:
        if ((puVar7[1] == 1) && (puVar11[1] == 1)) {
          return pDVar10;
        }
        cuddCacheInsert(manager,6,f,g,cube,pDVar10);
        return pDVar10;
      }
      cube = (cube->type).kids.T;
    } while (cube != pDVar5);
  }
  pDVar5 = cuddBddAndRecur(manager,f,g);
  return pDVar5;
}

Assistant:

DdNode *
cuddBddAndAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube)
{
    DdNode *F, *ft, *fe, *G, *gt, *ge;
    DdNode *one, *zero, *r, *t, *e;
    unsigned int topf, topg, topcube, top, index;

    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == zero || g == zero || f == Cudd_Not(g)) return(zero);
    if (f == one && g == one)   return(one);

    if (cube == one) {
        return(cuddBddAndRecur(manager, f, g));
    }
    if (f == one || f == g) {
        return(cuddBddExistAbstractRecur(manager, g, cube));
    }
    if (g == one) {
        return(cuddBddExistAbstractRecur(manager, f, cube));
    }
    /* At this point f, g, and cube are not constant. */

    if (f > g) { /* Try to increase cache efficiency. */
        DdNode *tmp = f;
        f = g;
        g = tmp;
    }

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    topf = manager->perm[F->index];
    topg = manager->perm[G->index];
    top = ddMin(topf, topg);
    topcube = manager->perm[cube->index];

    while (topcube < top) {
        cube = cuddT(cube);
        if (cube == one) {
            return(cuddBddAndRecur(manager, f, g));
        }
        topcube = manager->perm[cube->index];
    }
    /* Now, topcube >= top. */

    /* Check cache. */
    if (F->ref != 1 || G->ref != 1) {
        r = cuddCacheLookup(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube);
        if (r != NULL) {
            return(r);
        }
    }

    if ( manager->TimeStop && Abc_Clock() > manager->TimeStop )
        return NULL;

    if (topf == top) {
        index = F->index;
        ft = cuddT(F);
        fe = cuddE(F);
        if (Cudd_IsComplement(f)) {
            ft = Cudd_Not(ft);
            fe = Cudd_Not(fe);
        }
    } else {
        index = G->index;
        ft = fe = f;
    }

    if (topg == top) {
        gt = cuddT(G);
        ge = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gt = Cudd_Not(gt);
            ge = Cudd_Not(ge);
        }
    } else {
        gt = ge = g;
    }

    if (topcube == top) {       /* quantify */
        DdNode *Cube = cuddT(cube);
        t = cuddBddAndAbstractRecur(manager, ft, gt, Cube);
        if (t == NULL) return(NULL);
        /* Special case: 1 OR anything = 1. Hence, no need to compute
        ** the else branch if t is 1. Likewise t + t * anything == t.
        ** Notice that t == fe implies that fe does not depend on the
        ** variables in Cube. Likewise for t == ge.
        */
        if (t == one || t == fe || t == ge) {
            if (F->ref != 1 || G->ref != 1)
                cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG,
                                f, g, cube, t);
            return(t);
        }
        cuddRef(t);
        /* Special case: t + !t * anything == t + anything. */
        if (t == Cudd_Not(fe)) {
            e = cuddBddExistAbstractRecur(manager, ge, Cube);
        } else if (t == Cudd_Not(ge)) {
            e = cuddBddExistAbstractRecur(manager, fe, Cube);
        } else {
            e = cuddBddAndAbstractRecur(manager, fe, ge, Cube);
        }
        if (e == NULL) {
            Cudd_IterDerefBdd(manager, t);
            return(NULL);
        }
        if (t == e) {
            r = t;
            cuddDeref(t);
        } else {
            cuddRef(e);
            r = cuddBddAndRecur(manager, Cudd_Not(t), Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
            cuddRef(r);
            Cudd_DelayedDerefBdd(manager, t);
            Cudd_DelayedDerefBdd(manager, e);
            cuddDeref(r);
        }
    } else {
        t = cuddBddAndAbstractRecur(manager, ft, gt, cube);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddBddAndAbstractRecur(manager, fe, ge, cube);
        if (e == NULL) {
            Cudd_IterDerefBdd(manager, t);
            return(NULL);
        }
        if (t == e) {
            r = t;
            cuddDeref(t);
        } else {
            cuddRef(e);
            if (Cudd_IsComplement(t)) {
                r = cuddUniqueInter(manager, (int) index,
                                    Cudd_Not(t), Cudd_Not(e));
                if (r == NULL) {
                    Cudd_IterDerefBdd(manager, t);
                    Cudd_IterDerefBdd(manager, e);
                    return(NULL);
                }
                r = Cudd_Not(r);
            } else {
                r = cuddUniqueInter(manager,(int)index,t,e);
                if (r == NULL) {
                    Cudd_IterDerefBdd(manager, t);
                    Cudd_IterDerefBdd(manager, e);
                    return(NULL);
                }
            }
            cuddDeref(e);
            cuddDeref(t);
        }
    }

    if (F->ref != 1 || G->ref != 1)
        cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube, r);
    return (r);

}